

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

void drawHighlight(int nodeIndex)

{
  pointer pbVar1;
  pointer pnVar2;
  WINDOW *pWVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  pointer pcVar7;
  
  pnVar2 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
            _M_start[nodeIndex].pc == 0) {
    pWVar3 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
             _M_start[nodeIndex].w_code;
    pbVar1 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
             _M_start[nodeIndex].inputCode.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar7 = pbVar1[-1]._M_dataplus._M_p;
    uVar6 = (ulong)((int)((ulong)((long)pbVar1 -
                                 (long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                                       super__Vector_impl_data._M_start[nodeIndex].inputCode.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1);
  }
  else {
    uVar6 = (long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                  super__Vector_impl_data._M_start[nodeIndex].pc - 1;
    pWVar3 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
             _M_start[nodeIndex].w_code;
    pcVar7 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
             _M_start[nodeIndex].inputCode.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p;
  }
  mvwprintw(pWVar3,uVar6,0,"%s",pcVar7);
  pWVar3 = pnVar2[nodeIndex].w_code;
  if (pWVar3 == (WINDOW *)0x0) {
    iVar5 = -1;
    iVar4 = iVar5;
  }
  else {
    iVar5 = (int)pWVar3->_begx;
    iVar4 = (int)pWVar3->_begy;
  }
  if (pnVar2[nodeIndex].w_highlight != (WINDOW *)0x0) {
    delwin();
  }
  pnVar2 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pWVar3 = (WINDOW *)
           newwin(1,0x12,iVar4 + grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                                 super__Vector_impl_data._M_start[nodeIndex].pc,iVar5);
  pnVar2[nodeIndex].w_highlight = pWVar3;
  wattr_on(pWVar3,0x100,0);
  wbkgd(pnVar2[nodeIndex].w_highlight,0x100);
  wbkgd(pnVar2[nodeIndex].w_code,0x500);
  mvwprintw(pnVar2[nodeIndex].w_highlight,0,0,"%s",
            pnVar2[nodeIndex].inputCode.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[pnVar2[nodeIndex].pc]._M_dataplus._M_p);
  wrefresh(pnVar2[nodeIndex].w_code);
  wrefresh(pnVar2[nodeIndex].w_highlight);
  return;
}

Assistant:

void drawHighlight(int nodeIndex){
  node *tmp_node =&grid[nodeIndex];
  int beg_x, beg_y;
  if(tmp_node->pc==0){
    mvwprintw(tmp_node->w_code, tmp_node->inputCode.size()-1, 0, "%s", tmp_node->inputCode[tmp_node->inputCode.size()-1].c_str());
  }
  else{
    mvwprintw(tmp_node->w_code, tmp_node->pc-1, 0, "%s", tmp_node->inputCode[tmp_node->pc-1].c_str());
  }
  getbegyx(tmp_node->w_code, beg_y, beg_x);
  if(tmp_node->w_highlight){
    //werase(tmp_node->w_highlight);
    delwin(tmp_node->w_highlight);
  }
  tmp_node=&grid[nodeIndex];
  //start_color();
  tmp_node->w_highlight = newwin(1, CODE_WIDTH - 2, beg_y+tmp_node->pc, beg_x);
  //init_pair(1, COLOR_BLACK, COLOR_WHITE);
  wattron(tmp_node->w_highlight,COLOR_PAIR(1));
  wbkgd(tmp_node->w_highlight, COLOR_PAIR(1));
  wbkgd(tmp_node->w_code, COLOR_PAIR(5));
  mvwprintw(tmp_node->w_highlight, 0, 0, "%s", tmp_node->inputCode[tmp_node->pc].c_str());
  wrefresh(tmp_node->w_code);
  wrefresh(tmp_node->w_highlight);
}